

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>::~ExceptionOr
          (ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>_2
  node;
  
  if (((this->value).ptr.isSet == true) &&
     (node = (this->value).ptr.field_1,
     node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>_2
              )0x0)) {
    (this->value).ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>_2
          )0x0;
    PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;